

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMakeUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::pipeline::makeComputePipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkPipelineLayout pipelineLayout,VkShaderModule shaderModule,
          VkSpecializationInfo *specInfo)

{
  VkPipelineCache local_d0;
  undefined1 local_c8 [8];
  VkComputePipelineCreateInfo pipelineInfo;
  VkPipelineShaderStageCreateInfo shaderStageInfo;
  VkSpecializationInfo *specInfo_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkShaderModule shaderModule_local;
  VkPipelineLayout pipelineLayout_local;
  
  pipelineInfo.basePipelineIndex = 0x12;
  local_c8._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  pipelineInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineInfo._4_4_ = 0;
  pipelineInfo.pNext._0_4_ = 0;
  memcpy(&pipelineInfo.flags,&pipelineInfo.basePipelineIndex,0x30);
  pipelineInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)pipelineLayout.m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&pipelineInfo.layout,0);
  pipelineInfo.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_d0,0);
  ::vk::createComputePipeline
            (__return_storage_ptr__,vk,device,local_d0,(VkComputePipelineCreateInfo *)local_c8,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> makeComputePipeline (const DeviceInterface&		vk,
									  const VkDevice				device,
									  const VkPipelineLayout		pipelineLayout,
									  const VkShaderModule			shaderModule,
									  const VkSpecializationInfo*	specInfo)
{
	const VkPipelineShaderStageCreateInfo shaderStageInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags	flags;
		VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits			stage;
		shaderModule,											// VkShaderModule					module;
		"main",													// const char*						pName;
		specInfo,												// const VkSpecializationInfo*		pSpecializationInfo;
	};
	const VkComputePipelineCreateInfo pipelineInfo =
	{
		VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,		// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		(VkPipelineCreateFlags)0,							// VkPipelineCreateFlags			flags;
		shaderStageInfo,									// VkPipelineShaderStageCreateInfo	stage;
		pipelineLayout,										// VkPipelineLayout					layout;
		DE_NULL,											// VkPipeline						basePipelineHandle;
		0,													// deInt32							basePipelineIndex;
	};
	return createComputePipeline(vk, device, DE_NULL , &pipelineInfo);
}